

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage_converter.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  _Setprecision _Var3;
  _Setw _Var4;
  ostream *poVar5;
  pointer pbVar6;
  undefined8 uVar7;
  int iVar8;
  int passed;
  exception *e;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  cvt;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  *in_stack_ffffffffffffd7f8;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  *in_stack_ffffffffffffd800;
  string *in_stack_ffffffffffffd808;
  runtime_error *in_stack_ffffffffffffd810;
  char *in_stack_ffffffffffffd828;
  allocator *paVar9;
  base_converter *in_stack_ffffffffffffd830;
  uint codepoint;
  base_converter *in_stack_ffffffffffffd838;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  *in_stack_ffffffffffffdb90;
  allocator local_10d1;
  string local_10d0 [32];
  string local_10b0 [22];
  undefined1 local_109a;
  allocator local_1099;
  string local_1098 [39];
  allocator local_1071;
  string local_1070 [32];
  string local_1050 [14];
  undefined1 local_1042;
  allocator local_1041;
  string local_1040 [38];
  undefined1 local_101a;
  allocator local_1019;
  string local_1018 [38];
  undefined1 local_ff2;
  allocator local_ff1;
  string local_ff0 [38];
  undefined1 local_fca;
  allocator local_fc9;
  string local_fc8 [38];
  undefined1 local_fa2;
  allocator local_fa1;
  string local_fa0 [38];
  undefined1 local_f7a;
  allocator local_f79;
  string local_f78 [38];
  undefined1 local_f52;
  allocator local_f51;
  string local_f50 [38];
  undefined1 local_f2a;
  allocator local_f29;
  string local_f28 [38];
  undefined1 local_f02;
  allocator local_f01;
  string local_f00 [38];
  undefined1 local_eda;
  allocator local_ed9;
  string local_ed8 [38];
  undefined1 local_eb2;
  allocator local_eb1;
  string local_eb0 [38];
  undefined1 local_e8a;
  allocator local_e89;
  string local_e88 [38];
  undefined1 local_e62;
  allocator local_e61;
  string local_e60 [38];
  undefined1 local_e3a;
  allocator local_e39;
  string local_e38 [38];
  undefined1 local_e12;
  allocator local_e11;
  string local_e10 [38];
  undefined1 local_dea;
  allocator local_de9;
  string local_de8 [39];
  allocator local_dc1;
  string local_dc0 [32];
  string local_da0 [14];
  undefined1 local_d92;
  allocator local_d91;
  string local_d90 [38];
  undefined1 local_d6a;
  allocator local_d69;
  string local_d68 [38];
  undefined1 local_d42;
  allocator local_d41;
  string local_d40 [38];
  undefined1 local_d1a;
  allocator local_d19;
  string local_d18 [38];
  undefined1 local_cf2;
  allocator local_cf1;
  string local_cf0 [38];
  undefined1 local_cca;
  allocator local_cc9;
  string local_cc8 [38];
  undefined1 local_ca2;
  allocator local_ca1;
  string local_ca0 [38];
  undefined1 local_c7a;
  allocator local_c79;
  string local_c78 [38];
  undefined1 local_c52;
  allocator local_c51;
  string local_c50 [38];
  undefined1 local_c2a;
  allocator local_c29;
  string local_c28 [38];
  undefined1 local_c02;
  allocator local_c01;
  string local_c00 [38];
  undefined1 local_bda;
  allocator local_bd9;
  string local_bd8 [38];
  undefined1 local_bb2;
  allocator local_bb1;
  string local_bb0 [38];
  undefined1 local_b8a;
  allocator local_b89;
  string local_b88 [38];
  undefined1 local_b62;
  allocator local_b61;
  string local_b60 [38];
  undefined1 local_b3a;
  allocator local_b39;
  string local_b38 [38];
  undefined1 local_b12;
  allocator local_b11;
  string local_b10 [38];
  undefined1 local_aea;
  allocator local_ae9;
  string local_ae8 [38];
  undefined1 local_ac2;
  allocator local_ac1;
  string local_ac0 [38];
  undefined1 local_a9a;
  allocator local_a99;
  string local_a98 [38];
  undefined1 local_a72;
  allocator local_a71;
  string local_a70 [38];
  undefined1 local_a4a;
  allocator local_a49;
  string local_a48 [38];
  undefined1 local_a22;
  allocator local_a21;
  string local_a20 [38];
  undefined1 local_9fa;
  allocator local_9f9;
  string local_9f8 [38];
  undefined1 local_9d2;
  allocator local_9d1;
  string local_9d0 [38];
  undefined1 local_9aa;
  allocator local_9a9;
  string local_9a8 [38];
  undefined1 local_982;
  allocator local_981;
  string local_980 [38];
  undefined1 local_95a;
  allocator local_959;
  string local_958 [38];
  undefined1 local_932;
  allocator local_931;
  string local_930 [38];
  undefined1 local_90a;
  allocator local_909;
  string local_908 [38];
  undefined1 local_8e2;
  allocator local_8e1;
  string local_8e0 [38];
  undefined1 local_8ba;
  allocator local_8b9;
  string local_8b8 [38];
  undefined1 local_892;
  allocator local_891;
  string local_890 [38];
  undefined1 local_86a;
  allocator local_869;
  string local_868 [38];
  undefined1 local_842;
  allocator local_841;
  string local_840 [38];
  undefined1 local_81a;
  allocator local_819;
  string local_818 [38];
  undefined1 local_7f2;
  allocator local_7f1;
  string local_7f0 [38];
  undefined1 local_7ca;
  allocator local_7c9;
  string local_7c8 [38];
  undefined1 local_7a2;
  allocator local_7a1;
  string local_7a0 [38];
  undefined1 local_77a;
  allocator local_779;
  string local_778 [38];
  undefined1 local_752;
  allocator local_751;
  string local_750 [38];
  undefined1 local_72a;
  allocator local_729;
  string local_728 [38];
  undefined1 local_702;
  allocator local_701;
  string local_700 [38];
  undefined1 local_6da;
  allocator local_6d9;
  string local_6d8 [38];
  undefined1 local_6b2;
  allocator local_6b1;
  string local_6b0 [38];
  undefined1 local_68a;
  allocator local_689;
  string local_688 [38];
  undefined1 local_662;
  allocator local_661;
  string local_660 [38];
  undefined1 local_63a;
  allocator local_639;
  string local_638 [38];
  undefined1 local_612;
  allocator local_611;
  string local_610 [38];
  undefined1 local_5ea;
  allocator local_5e9;
  string local_5e8 [38];
  undefined1 local_5c2;
  allocator local_5c1;
  string local_5c0 [38];
  undefined1 local_59a;
  allocator local_599;
  string local_598 [38];
  undefined1 local_572;
  allocator local_571;
  string local_570 [38];
  undefined1 local_54a;
  allocator local_549;
  string local_548 [38];
  undefined1 local_522;
  allocator local_521;
  string local_520 [38];
  undefined1 local_4fa;
  allocator local_4f9;
  string local_4f8 [38];
  undefined1 local_4d2;
  allocator local_4d1;
  string local_4d0 [38];
  undefined1 local_4aa;
  allocator local_4a9;
  string local_4a8 [38];
  undefined1 local_482;
  allocator local_481;
  string local_480 [38];
  undefined1 local_45a;
  allocator local_459;
  string local_458 [38];
  undefined1 local_432;
  allocator local_431;
  string local_430 [38];
  undefined1 local_40a;
  allocator local_409;
  string local_408 [38];
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0 [38];
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [38];
  undefined1 local_36a;
  allocator local_369;
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [38];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [38];
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [38];
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [38];
  undefined1 local_27a;
  allocator local_279;
  string local_278 [38];
  undefined1 local_252;
  allocator local_251;
  string local_250 [38];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [38];
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [38];
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [38];
  undefined1 local_18a;
  allocator local_189;
  string local_188 [38];
  undefined1 local_162;
  allocator local_161;
  string local_160 [38];
  undefined1 local_13a;
  allocator local_139;
  string local_138 [38];
  undefined1 local_112;
  allocator local_111;
  string local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [38];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [38];
  undefined1 local_9a;
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [38];
  undefined1 local_4a;
  allocator local_49;
  string local_48 [68];
  undefined4 local_4;
  
  local_4 = 0;
  std::
  unique_ptr<booster::locale::util::base_converter,std::default_delete<booster::locale::util::base_converter>>
  ::unique_ptr<std::default_delete<booster::locale::util::base_converter>,void>
            (in_stack_ffffffffffffd800);
  poVar5 = std::operator<<((ostream *)&std::cout,"Test UTF-8");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"- From UTF-8");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  booster::locale::util::create_utf8_converter();
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator=(in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::~unique_ptr(in_stack_ffffffffffffd800);
  test_counter = test_counter + 1;
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::get(in_stack_ffffffffffffd800);
  if (pbVar6 == (pointer)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7b);
    poVar5 = std::operator<<(poVar5," cvt.get()");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_4a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Error limits reached, stopping unit test",&local_49);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_4a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::operator->((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
                         *)0x108252);
  bVar1 = (**(code **)(*(long *)pbVar6 + 0x18))();
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7c);
    poVar5 = std::operator<<(poVar5," cvt->is_thread_safe()");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_72 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Error limits reached, stopping unit test",&local_71);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_72 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::operator->((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
                         *)0x108415);
  iVar8 = (**(code **)(*(long *)pbVar6 + 0x10))();
  if (iVar8 != 4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7d);
    poVar5 = std::operator<<(poVar5," cvt->max_len() == 4");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_9a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"Error limits reached, stopping unit test",&local_99);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_9a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Correct");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x81);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\x7f\",0x7f)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_c2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"Error limits reached, stopping unit test",&local_c1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_c2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x82);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xC2\\x80\",0x80)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_ea = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"Error limits reached, stopping unit test",&local_e9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_ea = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x83);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xdf\\xBF\",0x7FF)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_112 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Error limits reached, stopping unit test",&local_111);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_112 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x84);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xe0\\xa0\\x80\",0x800)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_13a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"Error limits reached, stopping unit test",&local_139);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_13a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x85);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xef\\xbf\\xbf\",0xFFFF)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_162 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"Error limits reached, stopping unit test",&local_161);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_162 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x86);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf0\\x90\\x80\\x80\",0x10000)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_18a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,"Error limits reached, stopping unit test",&local_189);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_18a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x87);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\\x8f\\xbf\\xbf\",0x10FFFF)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_1b2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"Error limits reached, stopping unit test",&local_1b1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_1b2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Too big");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8a);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\\x9f\\x80\\x80\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_1da = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"Error limits reached, stopping unit test",&local_1d9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_1da = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8b);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xfb\\xbf\\xbf\\xbf\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_202 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"Error limits reached, stopping unit test",&local_201);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_202 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8c);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf8\\x90\\x80\\x80\\x80\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_22a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"Error limits reached, stopping unit test",&local_229);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_22a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8d);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xfd\\xbf\\xbf\\xbf\\xbf\\xbf\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_252 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,"Error limits reached, stopping unit test",&local_251);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_252 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Invalid trail");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x90);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xC2\\x7F\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_27a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,"Error limits reached, stopping unit test",&local_279);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_27a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x91);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xdf\\x7F\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_2a2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"Error limits reached, stopping unit test",&local_2a1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_2a2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x92);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xe0\\x7F\\x80\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_2ca = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"Error limits reached, stopping unit test",&local_2c9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_2ca = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x93);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xef\\xbf\\x7F\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_2f2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"Error limits reached, stopping unit test",&local_2f1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_2f2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x94);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xe0\\x7F\\x80\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_31a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,"Error limits reached, stopping unit test",&local_319);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_31a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x95);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xef\\xbf\\x7F\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_342 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"Error limits reached, stopping unit test",&local_341);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_342 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x96);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf0\\x7F\\x80\\x80\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_36a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"Error limits reached, stopping unit test",&local_369);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_36a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x97);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\\x7f\\xbf\\xbf\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_392 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"Error limits reached, stopping unit test",&local_391);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_392 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x98);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf0\\x90\\x7F\\x80\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_3ba = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b8,"Error limits reached, stopping unit test",&local_3b9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_3ba = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x99);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\\x8f\\x7F\\xbf\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_3e2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"Error limits reached, stopping unit test",&local_3e1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_3e2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9a);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf0\\x90\\x80\\x7F\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_40a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,"Error limits reached, stopping unit test",&local_409);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_40a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9b);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\\x8f\\xbf\\x7F\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_432 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_430,"Error limits reached, stopping unit test",&local_431);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_432 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Invalid length");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make2(0x80);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa0);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make2(0x80),0x80)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_45a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_458,"Error limits reached, stopping unit test",&local_459);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_45a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make2(0x7ff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa1);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make2(0x7ff),0x7ff)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_482 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_480,"Error limits reached, stopping unit test",&local_481);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_482 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0x800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa3);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0x800),0x800)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_4aa = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a8,"Error limits reached, stopping unit test",&local_4a9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_4aa = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0xffff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa4);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0xffff),0xffff)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_4d2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,"Error limits reached, stopping unit test",&local_4d1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_4d2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x10000);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa6);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x10000),0x10000)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_4fa = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f8,"Error limits reached, stopping unit test",&local_4f9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_4fa = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x10ffff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa7);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x10ffff),0x10ffff)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_522 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_520,"Error limits reached, stopping unit test",&local_521);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_522 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x110000);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa9);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x110000),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_54a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_548,"Error limits reached, stopping unit test",&local_549);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_54a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x1fffff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xaa);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x1fffff),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_572 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_570,"Error limits reached, stopping unit test",&local_571);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_572 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make2(0);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xac);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make2(0),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_59a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_598,"Error limits reached, stopping unit test",&local_599);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_59a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xad);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_5c2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,"Error limits reached, stopping unit test",&local_5c1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_5c2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xae);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_5ea = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,"Error limits reached, stopping unit test",&local_5e9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_5ea = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make2(0x7f);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xaf);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make2(0x7f),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_612 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_610,"Error limits reached, stopping unit test",&local_611);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_612 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0x7f);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb0);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0x7f),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_63a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_638,"Error limits reached, stopping unit test",&local_639);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_63a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x7f);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb1);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x7f),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_662 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_660,"Error limits reached, stopping unit test",&local_661);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_662 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0x80);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb3);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0x80),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_68a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_688,"Error limits reached, stopping unit test",&local_689);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_68a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x80);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb4);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x80),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_6b2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6b0,"Error limits reached, stopping unit test",&local_6b1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_6b2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0x7ff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb5);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0x7ff),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_6da = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6d8,"Error limits reached, stopping unit test",&local_6d9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_6da = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x7ff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb6);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x7ff),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_702 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_700,"Error limits reached, stopping unit test",&local_701);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_702 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0x8000);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb8);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0x8000),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_72a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_728,"Error limits reached, stopping unit test",&local_729);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_72a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0xffff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb9);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0xffff),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_752 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_750,"Error limits reached, stopping unit test",&local_751);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_752 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Invalid surrogate");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0xd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xbd);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0xD800),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_77a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_778,"Error limits reached, stopping unit test",&local_779);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_77a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0xdbff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xbe);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0xDBFF),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_7a2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a0,"Error limits reached, stopping unit test",&local_7a1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_7a2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0xdc00);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xbf);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0xDC00),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_7ca = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c8,"Error limits reached, stopping unit test",&local_7c9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_7ca = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make3(0xdfff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc0);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make3(0xDFFF),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_7f2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7f0,"Error limits reached, stopping unit test",&local_7f1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_7f2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0xd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc2);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0xD800),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_81a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_818,"Error limits reached, stopping unit test",&local_819);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_81a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0xdbff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc3);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0xDBFF),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_842 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_840,"Error limits reached, stopping unit test",&local_841);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_842 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0xdc00);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc4);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0xDC00),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_86a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_868,"Error limits reached, stopping unit test",&local_869);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_86a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  make4(0xdfff);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc5);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,make4(0xDFFF),illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_892 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_890,"Error limits reached, stopping unit test",&local_891);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_892 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Incomplete");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc9);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\x80\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_8ba = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8b8,"Error limits reached, stopping unit test",&local_8b9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_8ba = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xca);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xC2\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_8e2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8e0,"Error limits reached, stopping unit test",&local_8e1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_8e2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xcc);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xdf\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_90a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_908,"Error limits reached, stopping unit test",&local_909);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_90a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xce);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xe0\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_932 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_930,"Error limits reached, stopping unit test",&local_931);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_932 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xcf);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xe0\\xa0\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_95a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_958,"Error limits reached, stopping unit test",&local_959);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_95a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd1);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xef\\xbf\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_982 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_980,"Error limits reached, stopping unit test",&local_981);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_982 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd2);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xef\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_9aa = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9a8,"Error limits reached, stopping unit test",&local_9a9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_9aa = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd4);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf0\\x90\\x80\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_9d2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9d0,"Error limits reached, stopping unit test",&local_9d1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_9d2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd5);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf0\\x90\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_9fa = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9f8,"Error limits reached, stopping unit test",&local_9f9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_9fa = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd6);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf0\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_a22 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a20,"Error limits reached, stopping unit test",&local_a21);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_a22 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd8);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\\x8f\\xbf\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_a4a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a48,"Error limits reached, stopping unit test",&local_a49);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_a4a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd9);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\\x8f\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_a72 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a70,"Error limits reached, stopping unit test",&local_a71);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_a72 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xda);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xf4\",incomplete)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_a9a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a98,"Error limits reached, stopping unit test",&local_a99);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_a9a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"- To UTF-8");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Test correct");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,(uint)((ulong)in_stack_ffffffffffffd830 >> 0x20),
                    in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe0);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x7f,\"\\x7f\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_ac2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ac0,"Error limits reached, stopping unit test",&local_ac1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_ac2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,(uint)((ulong)in_stack_ffffffffffffd830 >> 0x20),
                    in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe1);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x80,\"\\xC2\\x80\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_aea = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ae8,"Error limits reached, stopping unit test",&local_ae9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_aea = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,(uint)((ulong)in_stack_ffffffffffffd830 >> 0x20),
                    in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe2);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x7FF,\"\\xdf\\xBF\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_b12 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b10,"Error limits reached, stopping unit test",&local_b11);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_b12 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_incomplete(in_stack_ffffffffffffd830,(uint)((ulong)in_stack_ffffffffffffd828 >> 0x20)
                          ,(int)in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe3);
    poVar5 = std::operator<<(poVar5," test_incomplete(*cvt,0x7FF,1)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_b3a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b38,"Error limits reached, stopping unit test",&local_b39);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_b3a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,(uint)((ulong)in_stack_ffffffffffffd830 >> 0x20),
                    in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe4);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x800,\"\\xe0\\xa0\\x80\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_b62 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b60,"Error limits reached, stopping unit test",&local_b61);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_b62 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_incomplete(in_stack_ffffffffffffd830,(uint)((ulong)in_stack_ffffffffffffd828 >> 0x20)
                          ,(int)in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe5);
    poVar5 = std::operator<<(poVar5," test_incomplete(*cvt,0x800,2)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_b8a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b88,"Error limits reached, stopping unit test",&local_b89);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_b8a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_incomplete(in_stack_ffffffffffffd830,(uint)((ulong)in_stack_ffffffffffffd828 >> 0x20)
                          ,(int)in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe6);
    poVar5 = std::operator<<(poVar5," test_incomplete(*cvt,0x800,1)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_bb2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bb0,"Error limits reached, stopping unit test",&local_bb1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_bb2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,(uint)((ulong)in_stack_ffffffffffffd830 >> 0x20),
                    in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe7);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0xFFFF,\"\\xef\\xbf\\xbf\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_bda = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bd8,"Error limits reached, stopping unit test",&local_bd9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_bda = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_incomplete(in_stack_ffffffffffffd830,(uint)((ulong)in_stack_ffffffffffffd828 >> 0x20)
                          ,(int)in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe8);
    poVar5 = std::operator<<(poVar5," test_incomplete(*cvt,0x10000,3)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_c02 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c00,"Error limits reached, stopping unit test",&local_c01);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_c02 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_incomplete(in_stack_ffffffffffffd830,(uint)((ulong)in_stack_ffffffffffffd828 >> 0x20)
                          ,(int)in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe9);
    poVar5 = std::operator<<(poVar5," test_incomplete(*cvt,0x10000,2)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_c2a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c28,"Error limits reached, stopping unit test",&local_c29);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_c2a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_incomplete(in_stack_ffffffffffffd830,(uint)((ulong)in_stack_ffffffffffffd828 >> 0x20)
                          ,(int)in_stack_ffffffffffffd828);
  codepoint = (uint)((ulong)in_stack_ffffffffffffd830 >> 0x20);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xea);
    poVar5 = std::operator<<(poVar5," test_incomplete(*cvt,0x10000,1)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_c52 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c50,"Error limits reached, stopping unit test",&local_c51);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_c52 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xeb);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x10000,\"\\xf0\\x90\\x80\\x80\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_c7a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c78,"Error limits reached, stopping unit test",&local_c79);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_c7a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xec);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x10FFFF,\"\\xf4\\x8f\\xbf\\xbf\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_ca2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ca0,"Error limits reached, stopping unit test",&local_ca1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_ca2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Test no surrogate ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf0);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0xD800,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_cca = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cc8,"Error limits reached, stopping unit test",&local_cc9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_cca = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf1);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0xDBFF,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_cf2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cf0,"Error limits reached, stopping unit test",&local_cf1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_cf2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf2);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0xDC00,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_d1a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d18,"Error limits reached, stopping unit test",&local_d19);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_d1a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf3);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0xDFFF,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_d42 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d40,"Error limits reached, stopping unit test",&local_d41);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_d42 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Test invalid ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf7);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x110000,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_d6a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d68,"Error limits reached, stopping unit test",&local_d69);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_d6a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf8);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x1FFFFF,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_d92 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d90,"Error limits reached, stopping unit test",&local_d91);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_d92 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Test windows-1255");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc0,"windows-1255",&local_dc1);
  booster::locale::util::create_simple_converter(local_da0);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator=(in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::~unique_ptr(in_stack_ffffffffffffd800);
  std::__cxx11::string::~string(local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
  test_counter = test_counter + 1;
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::get(in_stack_ffffffffffffd800);
  if (pbVar6 == (pointer)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xff);
    poVar5 = std::operator<<(poVar5," cvt.get()");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_dea = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_de8,"Error limits reached, stopping unit test",&local_de9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_dea = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::operator->((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
                         *)0x1124e2);
  bVar1 = (**(code **)(*(long *)pbVar6 + 0x18))();
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x100);
    poVar5 = std::operator<<(poVar5," cvt->is_thread_safe()");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_e12 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e10,"Error limits reached, stopping unit test",&local_e11);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_e12 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::operator->((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
                         *)0x1126a5);
  iVar8 = (**(code **)(*(long *)pbVar6 + 0x10))();
  if (iVar8 != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x101);
    poVar5 = std::operator<<(poVar5," cvt->max_len() == 1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_e3a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e38,"Error limits reached, stopping unit test",&local_e39);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_e3a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"- From 1255");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x105);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xa4\",0x20aa)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_e62 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e60,"Error limits reached, stopping unit test",&local_e61);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_e62 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x106);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xe0\",0x05d0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_e8a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e88,"Error limits reached, stopping unit test",&local_e89);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_e8a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x107);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xc4\",0x5b4)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_eb2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_eb0,"Error limits reached, stopping unit test",&local_eb1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_eb2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x108);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xfb\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_eda = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ed8,"Error limits reached, stopping unit test",&local_ed9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_eda = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x109);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xdd\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_f02 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f00,"Error limits reached, stopping unit test",&local_f01);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_f02 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10a);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xff\",illegal)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_f2a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f28,"Error limits reached, stopping unit test",&local_f29);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_f2a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_to((base_converter *)in_stack_ffffffffffffd810,(char *)in_stack_ffffffffffffd808,
                  (uint)((ulong)in_stack_ffffffffffffd800 >> 0x20));
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10b);
    poVar5 = std::operator<<(poVar5," test_to(*cvt,\"\\xfe\",0x200f)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_f52 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f50,"Error limits reached, stopping unit test",&local_f51);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_f52 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"- To 1255");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10f);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x20aa,\"\\xa4\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_f7a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f78,"Error limits reached, stopping unit test",&local_f79);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_f7a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x110);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x05d0,\"\\xe0\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_fa2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fa0,"Error limits reached, stopping unit test",&local_fa1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_fa2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x111);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x5b4,\"\\xc4\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_fca = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fc8,"Error limits reached, stopping unit test",&local_fc9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_fca = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x112);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0x200f,\"\\xfe\")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_ff2 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ff0,"Error limits reached, stopping unit test",&local_ff1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_ff2 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x114);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0xe4,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_101a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1018,"Error limits reached, stopping unit test",&local_1019);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_101a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator*(in_stack_ffffffffffffd800);
  bVar2 = test_from(in_stack_ffffffffffffd838,codepoint,in_stack_ffffffffffffd828);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x115);
    poVar5 = std::operator<<(poVar5," test_from(*cvt,0xd0,0)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_1042 = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1040,"Error limits reached, stopping unit test",&local_1041);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_1042 = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing Shift-JIS using ICU/uconv");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1070,"Shift-JIS",&local_1071);
  booster::locale::impl_icu::create_uconv_converter(local_1050);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator=(in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::~unique_ptr(in_stack_ffffffffffffd800);
  std::__cxx11::string::~string(local_1070);
  std::allocator<char>::~allocator((allocator<char> *)&local_1071);
  test_counter = test_counter + 1;
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::get(in_stack_ffffffffffffd800);
  if (pbVar6 == (pointer)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11b);
    poVar5 = std::operator<<(poVar5," cvt.get()");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      local_109a = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1098,"Error limits reached, stopping unit test",&local_1099);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
      local_109a = 0;
      __cxa_throw(uVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::unique_ptr(in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8);
  test_shiftjis(in_stack_ffffffffffffdb90);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::~unique_ptr(in_stack_ffffffffffffd800);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing Shift-JIS using POSIX/iconv");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  paVar9 = &local_10d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10d0,"Shift-JIS",paVar9);
  booster::locale::impl_posix::create_iconv_converter(local_10b0);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::operator=(in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::~unique_ptr(in_stack_ffffffffffffd800);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
  pbVar6 = std::
           unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           ::get(in_stack_ffffffffffffd800);
  if (pbVar6 == (pointer)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"- Shift-JIS is not supported!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::
    unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
    ::unique_ptr(in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8);
    test_shiftjis(in_stack_ffffffffffffdb90);
    std::
    unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
    ::~unique_ptr(in_stack_ffffffffffffd800);
  }
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::~unique_ptr(in_stack_ffffffffffffd800);
  iVar8 = test_counter - error_counter;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
  poVar5 = std::operator<<(poVar5," tests");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (0 < error_counter) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_counter);
    poVar5 = std::operator<<(poVar5," tests");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = std::operator<<((ostream *)&std::cout," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
  _Var3 = std::setprecision(1);
  poVar5 = std::operator<<(poVar5,_Var3);
  _Var4 = std::setw(5);
  poVar5 = std::operator<<(poVar5,_Var4);
  poVar5 = (ostream *)
           std::ostream::operator<<(poVar5,((double)iVar8 * 100.0) / (double)test_counter);
  poVar5 = std::operator<<(poVar5,"% of tests completed sucsessefully");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return (uint)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        using namespace booster::locale::util;

        std::unique_ptr<base_converter> cvt;

        std::cout << "Test UTF-8" << std::endl;
        std::cout << "- From UTF-8" << std::endl;


        cvt = create_utf8_converter();
        TEST(cvt.get());
        TEST(cvt->is_thread_safe());
        TEST(cvt->max_len() == 4);

        std::cout << "-- Correct" << std::endl;

        TEST_TO("\x7f",0x7f);
        TEST_TO("\xC2\x80",0x80);
        TEST_TO("\xdf\xBF",0x7FF);
        TEST_TO("\xe0\xa0\x80",0x800);
        TEST_TO("\xef\xbf\xbf",0xFFFF);
        TEST_TO("\xf0\x90\x80\x80",0x10000);
        TEST_TO("\xf4\x8f\xbf\xbf",0x10FFFF);

        std::cout << "-- Too big" << std::endl;
        TEST_TO("\xf4\x9f\x80\x80",illegal); //  11 0000
        TEST_TO("\xfb\xbf\xbf\xbf",illegal); // 3FF FFFF
        TEST_TO("\xf8\x90\x80\x80\x80",illegal);  // 400 0000
        TEST_TO("\xfd\xbf\xbf\xbf\xbf\xbf",illegal);  // 7fff ffff

        std::cout << "-- Invalid trail" << std::endl;
        TEST_TO("\xC2\x7F",illegal);
        TEST_TO("\xdf\x7F",illegal);
        TEST_TO("\xe0\x7F\x80",illegal);
        TEST_TO("\xef\xbf\x7F",illegal);
        TEST_TO("\xe0\x7F\x80",illegal);
        TEST_TO("\xef\xbf\x7F",illegal);
        TEST_TO("\xf0\x7F\x80\x80",illegal);
        TEST_TO("\xf4\x7f\xbf\xbf",illegal);
        TEST_TO("\xf0\x90\x7F\x80",illegal);
        TEST_TO("\xf4\x8f\x7F\xbf",illegal);
        TEST_TO("\xf0\x90\x80\x7F",illegal);
        TEST_TO("\xf4\x8f\xbf\x7F",illegal);

        std::cout << "-- Invalid length" << std::endl;

        /// Test that this actually works
        TEST_TO(make2(0x80),0x80);
        TEST_TO(make2(0x7ff),0x7ff);

        TEST_TO(make3(0x800),0x800);
        TEST_TO(make3(0xffff),0xffff);

        TEST_TO(make4(0x10000),0x10000);
        TEST_TO(make4(0x10ffff),0x10ffff);

        TEST_TO(make4(0x110000),illegal);
        TEST_TO(make4(0x1fffff),illegal);
        
        TEST_TO(make2(0),illegal);
        TEST_TO(make3(0),illegal);
        TEST_TO(make4(0),illegal);
        TEST_TO(make2(0x7f),illegal);
        TEST_TO(make3(0x7f),illegal);
        TEST_TO(make4(0x7f),illegal);

        TEST_TO(make3(0x80),illegal);
        TEST_TO(make4(0x80),illegal);
        TEST_TO(make3(0x7ff),illegal);
        TEST_TO(make4(0x7ff),illegal);

        TEST_TO(make4(0x8000),illegal);
        TEST_TO(make4(0xffff),illegal);
        
        std::cout << "-- Invalid surrogate" << std::endl;
        
        TEST_TO(make3(0xD800),illegal);
        TEST_TO(make3(0xDBFF),illegal);
        TEST_TO(make3(0xDC00),illegal);
        TEST_TO(make3(0xDFFF),illegal);

        TEST_TO(make4(0xD800),illegal);
        TEST_TO(make4(0xDBFF),illegal);
        TEST_TO(make4(0xDC00),illegal);
        TEST_TO(make4(0xDFFF),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        TEST_TO("\x80",illegal);
        TEST_TO("\xC2",incomplete);
        
        TEST_TO("\xdf",incomplete);

        TEST_TO("\xe0",incomplete);
        TEST_TO("\xe0\xa0",incomplete);

        TEST_TO("\xef\xbf",incomplete);
        TEST_TO("\xef",incomplete);

        TEST_TO("\xf0\x90\x80",incomplete);
        TEST_TO("\xf0\x90",incomplete);
        TEST_TO("\xf0",incomplete);

        TEST_TO("\xf4\x8f\xbf",incomplete);
        TEST_TO("\xf4\x8f",incomplete);
        TEST_TO("\xf4",incomplete);

        std::cout << "- To UTF-8" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        TEST_FROM("\x7f",0x7f);
        TEST_FROM("\xC2\x80",0x80);
        TEST_FROM("\xdf\xBF",0x7FF);
        TEST_INC(0x7FF,1);
        TEST_FROM("\xe0\xa0\x80",0x800);
        TEST_INC(0x800,2);
        TEST_INC(0x800,1);
        TEST_FROM("\xef\xbf\xbf",0xFFFF);
        TEST_INC(0x10000,3);
        TEST_INC(0x10000,2);
        TEST_INC(0x10000,1);
        TEST_FROM("\xf0\x90\x80\x80",0x10000);
        TEST_FROM("\xf4\x8f\xbf\xbf",0x10FFFF);
       
        std::cout << "-- Test no surrogate " << std::endl;
         
        TEST_FROM(0,0xD800);
        TEST_FROM(0,0xDBFF);
        TEST_FROM(0,0xDC00);
        TEST_FROM(0,0xDFFF);
        
        std::cout << "-- Test invalid " << std::endl;
        
        TEST_FROM(0,0x110000);
        TEST_FROM(0,0x1FFFFF);


        std::cout << "Test windows-1255" << std::endl;

        cvt = create_simple_converter("windows-1255");

        TEST(cvt.get());
        TEST(cvt->is_thread_safe());
        TEST(cvt->max_len() == 1);

        std::cout << "- From 1255" << std::endl;

        TEST_TO("\xa4",0x20aa);
        TEST_TO("\xe0",0x05d0);
        TEST_TO("\xc4",0x5b4);
        TEST_TO("\xfb",illegal);
        TEST_TO("\xdd",illegal);
        TEST_TO("\xff",illegal);
        TEST_TO("\xfe",0x200f);

        std::cout << "- To 1255" << std::endl;

        TEST_FROM("\xa4",0x20aa);
        TEST_FROM("\xe0",0x05d0);
        TEST_FROM("\xc4",0x5b4);
        TEST_FROM("\xfe",0x200f);

        TEST_FROM(0,0xe4);
        TEST_FROM(0,0xd0);

        #ifdef BOOSTER_LOCALE_WITH_ICU
        std::cout << "Testing Shift-JIS using ICU/uconv" << std::endl;

        cvt = booster::locale::impl_icu::create_uconv_converter("Shift-JIS");
        TEST(cvt.get());
        test_shiftjis(std::move(cvt));
        #endif

        #if defined(BOOSTER_LOCALE_WITH_ICONV) && !defined(BOOSTER_LOCALE_NO_POSIX_BACKEND)
        std::cout << "Testing Shift-JIS using POSIX/iconv" << std::endl;

        cvt = booster::locale::impl_posix::create_iconv_converter("Shift-JIS");
        if(cvt.get()) {
            test_shiftjis(std::move(cvt));
        }
        else {
            std::cout<< "- Shift-JIS is not supported!" << std::endl;
        }
        #endif

    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
}